

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

uint gpu::calcNChunk(size_t n,size_t group_size,size_t max_size)

{
  ulong uVar1;
  size_t exec_n;
  size_t work_parts_n;
  size_t max_size_local;
  size_t group_size_local;
  size_t n_local;
  
  n_local._4_4_ = (uint)group_size;
  if (n != 0) {
    uVar1 = ((n + max_size) - 1) / max_size;
    n_local._4_4_ =
         (int)(((((n + uVar1) - 1) / uVar1 + group_size) - 1) / group_size) * n_local._4_4_;
  }
  return n_local._4_4_;
}

Assistant:

unsigned int gpu::calcNChunk(size_t n, size_t group_size, size_t max_size)
{
	if (n == 0)
		return group_size;

	size_t work_parts_n = (n + max_size - 1) / max_size;
	size_t exec_n = (n + work_parts_n - 1) / work_parts_n;
	exec_n = (exec_n + group_size - 1) / group_size * group_size;
	return (unsigned int) exec_n;
}